

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Resize
          (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,map_index_t new_num_buckets)

{
  uint n;
  uint uVar1;
  NodeBase *pNVar2;
  NodeBase *pNVar3;
  NodeBase *node;
  uintptr_t v;
  NodeBase **ppNVar4;
  NodeBase **ppNVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 local_40 [16];
  
  if (new_num_buckets < 2) {
    KeyMapBase<std::__cxx11::string>::Resize();
  }
  else if ((new_num_buckets & new_num_buckets - 1) == 0) {
    n = (this->super_UntypedMapBase).num_buckets_;
    if ((ulong)n == 1) {
      (this->super_UntypedMapBase).index_of_first_non_null_ = new_num_buckets;
      (this->super_UntypedMapBase).num_buckets_ = new_num_buckets;
      ppNVar4 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,new_num_buckets);
      (this->super_UntypedMapBase).table_ = ppNVar4;
      return;
    }
    ppNVar4 = (this->super_UntypedMapBase).table_;
    (this->super_UntypedMapBase).num_buckets_ = new_num_buckets;
    ppNVar5 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,new_num_buckets);
    (this->super_UntypedMapBase).table_ = ppNVar5;
    uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
    uVar7 = (ulong)uVar1;
    (this->super_UntypedMapBase).index_of_first_non_null_ =
         (this->super_UntypedMapBase).num_buckets_;
    if (uVar1 < n) {
      do {
        node = ppNVar4[uVar7];
        while (node != (NodeBase *)0x0) {
          pNVar2 = node->next;
          pNVar3 = node[2].next;
          uVar6 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                            (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,node[1].next
                             ,pNVar3);
          uVar8 = ((ulong)pNVar3 ^ uVar6) * -0x234dd359734ecb13;
          ppNVar5 = (this->super_UntypedMapBase).table_;
          uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)ppNVar5) *
                  -0x234dd359734ecb13;
          lVar9 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)ppNVar5) *
                  -0x234dd359734ecb13;
          InsertUnique(this,((uint)(byte)((ulong)lVar9 >> 0x38) |
                             ((uint)((ulong)lVar9 >> 0x20) & 0xff0000) >> 8 |
                             (uint)((ulong)lVar9 >> 0x18) & 0xff0000 |
                            (uint)((ulong)lVar9 >> 8) & 0xff000000) &
                            (this->super_UntypedMapBase).num_buckets_ - 1,(KeyNode *)node);
          node = pNVar2;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != n);
    }
    UntypedMapBase::DeleteTable(&this->super_UntypedMapBase,ppNVar4,n);
    AssertLoadFactor(this);
    return;
  }
  KeyMapBase<std::__cxx11::string>::Resize(local_40);
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    ABSL_DCHECK(absl::has_single_bit(new_num_buckets));
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      for (KeyNode* node = static_cast<KeyNode*>(old_table[i]);
           node != nullptr;) {
        auto* next = static_cast<KeyNode*>(node->next);
        InsertUnique(BucketNumber(TS::ToView(node->key())), node);
        node = next;
      }
    }
    DeleteTable(old_table, old_table_size);
    AssertLoadFactor();
  }